

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-expr-visitor.h
# Opt level: O1

void __thiscall
mp::BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes>::VisitUnsupported
          (BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes> *this,Expr e)

{
  UnsupportedError *__return_storage_ptr__;
  logic_error *this_00;
  
  __return_storage_ptr__ = (UnsupportedError *)__cxa_allocate_exception(0x18);
  if ((ulong)*(uint *)e.super_ExprBase.impl_ < 0x48) {
    MakeUnsupportedError<>
              (__return_storage_ptr__,
               (CStringRef)internal::ExprInfo::INFO[*(uint *)e.super_ExprBase.impl_].str);
    __cxa_throw(__return_storage_ptr__,&UnsupportedError::typeinfo,fmt::SystemError::~SystemError);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"invalid expression kind");
  *(undefined ***)this_00 = &PTR__logic_error_001e3c18;
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Result VisitUnsupported(Expr e) {
    throw MakeUnsupportedError(str(e.kind()));
  }